

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void lj_record_ins(jit_State *J)

{
  IROp1 *pIVar1;
  SnapEntry *pSVar2;
  byte bVar3;
  IROp *pc;
  GCproto *pGVar4;
  GCproto *pGVar5;
  uint64_t uVar6;
  TValue *pTVar7;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar8;
  long lVar9;
  BCIns *pBVar10;
  SnapShot *pSVar11;
  TValue TVar12;
  TraceError TVar13;
  IRRef1 IVar14;
  IRRef1 IVar15;
  BCLine BVar16;
  uint uVar17;
  uint uVar18;
  LoopEvent LVar19;
  TRef TVar20;
  uint uVar21;
  int iVar22;
  BCReg func;
  TRef TVar23;
  TRef TVar24;
  TRef *pTVar25;
  IROp IVar26;
  MMS MVar27;
  IRType IVar28;
  ushort uVar29;
  IROpT IVar30;
  uint uVar31;
  IROp IVar32;
  cTValue *basev;
  ulong uVar33;
  ulong uVar34;
  undefined4 k;
  TraceLink linktype;
  int32_t iVar35;
  GCobj *pGVar36;
  ushort uVar37;
  ushort uVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  TValue *pTVar43;
  IROp IVar44;
  ulong uStack_110;
  ulong local_100;
  int local_f8;
  ulong local_e8;
  TValue local_d8;
  TValue TStack_d0;
  TValue TStack_c8;
  TValue local_c0;
  long local_b8;
  uint local_a8;
  IRRef1 IStack_a4;
  undefined2 uStack_a2;
  uint uStack_a0;
  IRRef1 local_9c;
  TRef local_98;
  undefined4 local_94;
  ulong local_90;
  uint local_84;
  long local_80;
  TValue local_78;
  double local_70;
  TValue local_68;
  TValue local_60;
  TRef local_48;
  TRef local_44;
  TRef local_40;
  TRef local_38;
  undefined4 local_34;
  TraceNo lnk;
  
  switch(J->postproc) {
  case LJ_POST_NONE:
    goto switchD_00149caf_caseD_0;
  case LJ_POST_FIXCOMP:
    pBVar10 = *(BCIns **)&J[-1].penalty[0x31].val;
    rec_comp_fixup(J,pBVar10,
                   *pBVar10 & 1 ^ (uint)(0xfffeffffffffffff < J[-1].penalty[0x32].pc.ptr64));
  case LJ_POST_FIXGUARD:
  case LJ_POST_FIXGUARDSNAP:
    if ((*(short *)((long)&J[-1].penalty[0x32].pc.ptr64 + 6) == -1) &&
       (pIVar1 = &(J->fold).ins.field_1.o, *pIVar1 = *pIVar1 ^ 1,
       J->postproc == LJ_POST_FIXGUARDSNAP)) {
      uVar34 = (ulong)(J->cur).nsnap;
      pSVar11 = (J->cur).snap;
      pSVar2 = (J->cur).snapmap +
               (((uint)pSVar11[uVar34 - 1].nent + pSVar11[uVar34 - 1].mapofs) - 1);
      *pSVar2 = *pSVar2 - 1;
    }
    lj_opt_fold(J);
switchD_00149caf_caseD_4:
    if (*(short *)((long)&J[-1].penalty[0x32].pc.ptr64 + 6) == -1) {
      for (uVar34 = 0; J->maxslot != uVar34; uVar34 = uVar34 + 1) {
        if ((J->base[uVar34] == 0x2007ffd) &&
           ((J->L->base[uVar34].u64 & 0xffff800000000000) == 0xffff000000000000)) {
          J->base[uVar34] = 0x1007ffe;
          break;
        }
      }
    }
    break;
  case LJ_POST_FIXBOOL:
    goto switchD_00149caf_caseD_4;
  case LJ_POST_FIXCONST:
    pTVar43 = J->L->base;
    for (uVar34 = 0; uVar34 < J->maxslot; uVar34 = uVar34 + 1) {
      if ((J->base[uVar34] == 0x7fff) && (pTVar43->u64 != 0xffffffffffffffff)) {
        TVar24 = lj_record_constify(J,pTVar43);
        J->base[uVar34] = TVar24;
      }
      pTVar43 = pTVar43 + 1;
    }
    break;
  case LJ_POST_FFRETRY:
    if (0x60 < (byte)*J->pc) {
      return;
    }
  }
  J->postproc = LJ_POST_NONE;
switchD_00149caf_caseD_0:
  if (J->needsnap != '\0') {
    J->needsnap = '\0';
    if (J->pt != (GCproto *)0x0) {
      lj_snap_purge(J);
    }
    lj_snap_add(J);
    J->mergesnap = '\x01';
  }
  if (J->bcskip != '\0') {
    J->bcskip = J->bcskip + 0xff;
    return;
  }
  pc = J->pc;
  if ((J->framedepth == 0) && (J->bc_extent <= (uint)((int)pc - *(int *)&J->bc_min))) {
    TVar13 = LJ_TRERR_LLEAVE;
    goto LAB_0014bd62;
  }
  if ((J->prof_mode != 0) && (pGVar4 = J->pt, pGVar4 != (GCproto *)0x0)) {
    pGVar5 = J->prev_pt;
    J->prev_pt = pGVar4;
    if (pGVar5 == (GCproto *)0x0 || pGVar5 == pGVar4) {
      if (J->prof_mode == 0x6c) {
        BVar16 = lj_debug_line(pGVar4,(BCPos)((ulong)((long)pc + (-0x68 - (long)pGVar4)) >> 2));
        iVar22 = J->prev_line;
        J->prev_line = BVar16;
        if (iVar22 != BVar16) goto LAB_00149d5f;
      }
    }
    else {
      J->prev_line = -1;
LAB_00149d5f:
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      lj_snap_add(J);
    }
  }
  pTVar43 = J->L->base;
  IVar44 = *pc;
  IVar26 = IVar44 & 0xff;
  uVar34 = (ulong)IVar26;
  uStack_a0 = 0;
  uVar39 = IVar44 >> 8 & 0xff;
  uVar33 = (ulong)uVar39;
  uVar29 = lj_bc_mode[uVar34];
  local_84 = uVar29 & 7;
  local_100 = uVar33;
  if ((short)local_84 == 3) {
    TStack_c8 = pTVar43[uVar33];
    uVar17 = J->base[uVar33];
    if (uVar17 == 0) {
      uVar17 = sload(J,uVar39);
    }
    local_100 = (ulong)uVar17;
    uStack_a0 = uVar17;
  }
  uVar39 = uStack_a0;
  uStack_110 = (ulong)(IVar44 >> 0x18);
  local_e8 = (ulong)(IVar44 >> 0x10 & 0xff);
  if ((uVar29 >> 3 & 0xf) == 3) {
    local_d8 = pTVar43[uStack_110];
    local_a8 = J->base[uStack_110];
    if (local_a8 == 0) {
      local_a8 = sload(J,IVar44 >> 0x18);
    }
    uStack_110 = (ulong)local_a8;
  }
  else if ((uVar29 >> 3 & 0xf) == 0) {
    uStack_110 = 0;
    local_e8 = (ulong)(IVar44 >> 0x10);
  }
  uVar17 = (uint)local_e8;
  switch(uVar29 >> 7 & 0xf) {
  case 3:
    TStack_d0 = (TValue)*(TValue *)&pTVar43[local_e8].field_4;
    uVar18 = J->base[local_e8];
    if (uVar18 == 0) {
      uVar18 = sload(J,uVar17);
    }
    break;
  default:
    goto switchD_00149ec2_caseD_4;
  case 8:
    TStack_d0.u64 = ~(local_e8 << 0x2f);
    uVar18 = uVar17 * 0xffffff + 0x7fff;
    break;
  case 9:
    uVar6 = (J->pt->k).ptr64;
    TStack_d0 = (TValue)*(TValue *)&((TValue *)(uVar6 + local_e8 * 8))->field_4;
    if (*(int *)(uVar6 + 4 + local_e8 * 8) == -0x18001) {
      TVar24 = lj_ir_kint(J,0);
      uVar18 = TVar24 | 0x100000;
    }
    else {
      uVar18 = lj_ir_knumint(J,*(lua_Number *)(uVar6 + local_e8 * 8));
    }
    break;
  case 10:
    pGVar36 = *(GCobj **)((J->pt->k).ptr64 + (long)(int)~uVar17 * 8);
    TStack_d0.u64 = (ulong)pGVar36 | 0xfffd800000000000;
    uVar18 = lj_ir_kgc(J,pGVar36,IRT_STR);
  }
  IStack_a4 = (IRRef1)uVar18;
  uStack_a2 = (undefined2)(uVar18 >> 0x10);
  local_e8 = (ulong)uVar18;
switchD_00149ec2_caseD_4:
  TVar12 = local_d8;
  uVar37 = (ushort)local_e8;
  lnk = (TraceNo)local_e8;
  uVar18 = (uint)uStack_110;
  uVar17 = (uint)(local_e8 >> 0x18);
  uVar38 = (ushort)local_100;
  switch(IVar44 & 0xff) {
  case IR_LT:
  case IR_GE:
  case IR_LE:
  case IR_GT:
    if ((((uint)local_100 & 0x1f000000) == 0xa000000) || ((lnk & 0x1f000000) == 0xa000000)) {
      MVar27 = MM_le - ((IVar44 & IR_LE) == IR_LT);
LAB_0014a200:
      rec_mm_comp_cdata(J,(RecordIndex *)&local_d8.gcr,IVar26,MVar27);
    }
    else {
      uVar18 = (uint)(local_100 >> 0x18);
      if ((((short)(uVar37 | uVar38) < 0) ||
          ((((uint)local_100 & 0x1f000000) != 0x4000000 && (5 < (uVar18 & 0x1e) - 0xe)))) ||
         (((lnk & 0x1f000000) != 0x4000000 && (5 < (uVar17 & 0x1e) - 0xe)))) {
        uVar18 = uVar18 & 0x1f;
        uVar31 = uVar18;
        if (uVar18 - 0xf < 5) {
          uVar31 = 0x13;
        }
        uVar21 = uVar17 & 0x1f;
        if ((uVar17 & 0x1f) - 0xf < 5) {
          uVar21 = 0x13;
        }
        if (uVar31 == uVar21) {
LAB_0014aed6:
          rec_comp_prep(J);
          if (uVar31 == 4) {
            iVar22 = lj_ir_strcmp((GCstr *)(TStack_c8.u64 & 0x7fffffffffff),
                                  (GCstr *)(TStack_d0.u64 & 0x7fffffffffff),IVar26);
            IVar32 = iVar22 == 0 ^ IVar26;
            TVar24 = lj_ir_call(J,IRCALL_lj_str_cmp,local_100,local_e8);
            local_100 = (ulong)TVar24;
            TVar24 = lj_ir_kint(J,0);
            local_e8 = (ulong)TVar24;
            uVar29 = 0x93;
          }
          else {
            if (uVar31 != 0x13) {
              if (uVar31 != 0xe) {
                local_a8 = uVar39;
                while( true ) {
                  MVar27 = MM_le - ((uVar34 & 2) == 0);
                  local_d8 = TStack_c8;
                  iVar22 = lj_record_mm_lookup(J,(RecordIndex *)&local_d8.gcr,MVar27);
                  TVar24 = local_98;
                  if (iVar22 != 0) break;
LAB_0014affe:
                  if ((uVar34 & 2) == 0) goto LAB_0014b20c;
                  local_a8 = CONCAT22(uStack_a2,IStack_a4);
                  IStack_a4 = (IRRef1)uStack_a0;
                  uStack_a2 = (undefined2)(uStack_a0 >> 0x10);
                  TVar12.u64 = TStack_d0.u64;
                  TStack_d0.u64 = TStack_c8.u64;
                  uVar34 = (ulong)((uint)uVar34 ^ 3);
                  TStack_c8.u64 = TVar12.u64;
                  uStack_a0 = local_a8;
                }
                local_78 = local_c0;
                if ((TStack_d0.u64 & 0xffff800000000000) == 0xfff9800000000000) {
                  if (local_b8 == *(long *)((TStack_d0.u64 & 0x7fffffffffff) + 0x20)) {
                    IVar14 = 0xb;
                    goto LAB_0014bbbd;
                  }
LAB_0014afb8:
                  local_a8 = CONCAT22(uStack_a2,IStack_a4);
                  local_d8.u64 = TStack_d0.u64;
                  iVar22 = lj_record_mm_lookup(J,(RecordIndex *)&local_d8.gcr,MVar27);
                  if ((iVar22 == 0) ||
                     (iVar22 = lj_record_objcmp(J,TVar24,local_98,&local_78,&local_c0), iVar22 != 0)
                     ) goto LAB_0014affe;
                }
                else {
                  if (((TStack_d0.u64 & 0xffff800000000000) != 0xfffa000000000000) ||
                     (local_b8 != *(long *)((TStack_d0.u64 & 0x7fffffffffff) + 0x20)))
                  goto LAB_0014afb8;
                  IVar14 = 5;
LAB_0014bbbd:
                  (J->fold).ins.field_0.ot = 0x450b;
                  (J->fold).ins.field_0.op1 = IStack_a4;
                  (J->fold).ins.field_0.op2 = IVar14;
                  TVar24 = lj_opt_fold(J);
                  (J->fold).ins.field_0.ot = 0x88b;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
                  (J->fold).ins.field_0.op2 = local_9c;
                  lj_opt_fold(J);
                }
                rec_mm_callcomp(J,(RecordIndex *)&local_d8.gcr,(uint)uVar34);
                break;
              }
              goto LAB_0014b351;
            }
            iVar22 = lj_ir_numcmp(TStack_c8.n,TStack_d0.n,IVar26);
            IVar32 = iVar22 == 0 ^ IVar26;
            uVar29 = 0x93;
          }
        }
        else {
          if ((uVar31 == 0x13) && (uVar21 == 0xe)) {
            (J->fold).ins.field_0.op1 = uVar38;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            TVar24 = lj_opt_fold(J);
            local_100 = (ulong)TVar24;
          }
          else {
            if ((uVar31 != 0xe) || (uVar21 != 0x13)) {
              if ((1 < uVar31 - 1) || (uVar31 = uVar18, 1 < uVar21 - 1)) break;
              goto LAB_0014aed6;
            }
            (J->fold).ins.field_0.op1 = uVar37;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            TVar24 = lj_opt_fold(J);
            local_e8 = (ulong)TVar24;
          }
          rec_comp_prep(J);
LAB_0014b351:
          IVar26 = IVar44 * 4 & IR_ULT ^ IVar26;
          iVar22 = lj_ir_numcmp(TStack_c8.n,TStack_d0.n,IVar26);
          IVar32 = IVar26 ^ IR_UGE;
          if (iVar22 != 0) {
            IVar32 = IVar26;
          }
          uVar29 = 0x8e;
        }
        (J->fold).ins.field_0.ot = (ushort)(IVar32 << 8) | uVar29;
        (J->fold).ins.field_0.op1 = (IRRef1)local_100;
        (J->fold).ins.field_0.op2 = (IRRef1)local_e8;
        lj_opt_fold(J);
        rec_comp_fixup(J,J->pc,(IVar44 ^ IVar32) & IR_GE);
      }
    }
    break;
  case IR_ULT:
  case IR_UGE:
  case IR_ULE:
  case IR_UGT:
  case IR_EQ:
  case IR_NE:
  case IR_ABC:
  case IR_RETF:
    uVar39 = (uint)local_100 & 0x1f000000;
    if ((uVar39 == 0xa000000) || ((lnk & 0x1f000000) == 0xa000000)) {
      MVar27 = MM_eq;
      goto LAB_0014a200;
    }
    if ((((short)(uVar37 | uVar38) < 0) || (uVar39 == 0xb000000)) || (uVar39 == 0xc000000)) {
      rec_comp_prep(J);
      iVar22 = lj_record_objcmp(J,(uint)local_100,lnk,&TStack_c8,&TStack_d0);
      if ((iVar22 == 2) || ((uVar39 != 0xb000000 && (uVar39 != 0xc000000)))) {
        rec_comp_fixup(J,J->pc,(byte)(iVar22 != 0 ^ (byte)IVar44) & 1);
      }
      else if (iVar22 == 1) {
        local_a8 = uStack_a0;
        local_d8 = TStack_c8;
        iVar22 = lj_record_mm_lookup(J,(RecordIndex *)&local_d8.gcr,MM_eq);
        TVar24 = local_98;
        if (iVar22 != 0) {
          local_78 = local_c0;
          if ((TStack_d0.u64 & 0xffff800000000000) == 0xfff9800000000000) {
            if (local_b8 == *(long *)((TStack_d0.u64 & 0x7fffffffffff) + 0x20)) {
              IVar14 = 0xb;
              goto LAB_0014b7ff;
            }
LAB_0014b670:
            local_a8 = CONCAT22(uStack_a2,IStack_a4);
            local_d8.u64 = TStack_d0.u64;
            iVar22 = lj_record_mm_lookup(J,(RecordIndex *)&local_d8.gcr,MM_eq);
            if ((iVar22 == 0) ||
               (iVar22 = lj_record_objcmp(J,TVar24,local_98,&local_78,&local_c0), iVar22 != 0))
            break;
          }
          else {
            if (((TStack_d0.u64 & 0xffff800000000000) != 0xfffa000000000000) ||
               (local_b8 != *(long *)((TStack_d0.u64 & 0x7fffffffffff) + 0x20))) goto LAB_0014b670;
            IVar14 = 5;
LAB_0014b7ff:
            (J->fold).ins.field_0.ot = 0x450b;
            (J->fold).ins.field_0.op1 = IStack_a4;
            (J->fold).ins.field_0.op2 = IVar14;
            TVar24 = lj_opt_fold(J);
            (J->fold).ins.field_0.ot = 0x88b;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
            (J->fold).ins.field_0.op2 = local_9c;
            lj_opt_fold(J);
          }
          rec_mm_callcomp(J,(RecordIndex *)&local_d8.gcr,IVar26);
        }
      }
    }
    break;
  case IR_NOP:
  case IR_BASE:
    uVar39 = 0;
    if ((((local_e8 & 0x1e000000) == 0 ^ (byte)IVar44) & 1) == 0) {
      uVar39 = lnk;
    }
    local_e8 = (ulong)uVar39;
  case IR_PVAL:
  case IR_GCSTEP:
    if ((uint)*(byte *)((long)pc + 5) < J->maxslot) {
      J->maxslot = (uint)*(byte *)((long)pc + 5);
    }
    break;
  case IR_HIOP:
  case IR_LOOP:
    if (lnk == 5) {
      uVar39 = lj_ir_tostr(J,(uint)local_100);
LAB_0014b0a3:
      local_100 = (ulong)uVar39;
    }
    else if (lnk == 0xf) {
      uVar39 = lj_ir_tonum(J,(uint)local_100);
      goto LAB_0014b0a3;
    }
    J->base[uVar33] = (TRef)local_100;
    break;
  case IR_USE:
    uVar39 = J->maxslot;
    if (uVar39 < (uint)local_100) {
      memset(J->base + uVar39,0,(ulong)((uint)local_100 - uVar39) << 2);
    }
    break;
  case IR_PHI:
    uVar34 = local_e8 & 0x1e000000;
    local_e8 = 0x1007ffe;
    if (uVar34 == 0) {
      local_e8 = 0x2007ffd;
    }
    goto switchD_00149fad_caseD_27;
  case IR_RENAME:
    if ((lnk & 0x1f000000) == 0x4000000 || (uVar17 & 0x1e) - 0xe < 6) {
      uVar39 = lj_opt_narrow_unm(J,lnk,&TStack_d0);
      goto LAB_0014b204;
    }
    local_d8.u64 = TStack_d0.u64;
    MVar27 = MM_unm;
    local_a8 = lnk;
    goto LAB_0014b0dc;
  case IR_PROF:
    if ((lnk & 0x1f000000) == 0xb000000) {
      (J->fold).ins.field_0.op1 = uVar37;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x49137fff;
      goto LAB_0014b1fc;
    }
    if ((lnk & 0x1f000000) == 0x4000000) {
      (J->fold).ins.field_0.op1 = uVar37;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130000;
      goto LAB_0014b1fc;
    }
    local_78.u64 = TStack_d0.u64;
    local_48 = lnk;
    iVar22 = lj_record_mm_lookup(J,(RecordIndex *)&local_78.gcr,MM_FAST);
    if (iVar22 == 0) {
      TVar13 = LJ_TRERR_NOMM;
      goto LAB_0014bd62;
    }
    func = rec_mm_prep(J,lj_cont_ra);
    pTVar25 = J->base;
    pTVar43 = J->L->base;
    pTVar25[func] = local_38;
    pTVar43[func] = local_60;
    pTVar25[(ulong)func + 2] = lnk;
    pTVar43[(ulong)func + 2].field_4 = (anon_struct_8_2_7fa0a05d_for_TValue_4)TStack_d0;
    pTVar25[(ulong)func + 3] = 0x7fff;
    pTVar43[(ulong)func + 3].u64 = 0xffffffffffffffff;
    lj_record_call(J,func,2);
    goto LAB_0014b248;
  case IR_KPRI:
  case IR_KINT:
  case IR_KGC:
  case IR_KPTR:
  case IR_BSWAP:
  case IR_BAND:
  case IR_BOR:
  case IR_BXOR:
    uVar34 = local_e8;
    local_e8 = uStack_110;
    goto LAB_0014a119;
  case IR_KKPTR:
  case IR_BSHL:
    local_e8 = uStack_110;
    uVar18 = lnk;
LAB_0014a2d3:
    if (((((uint)local_e8 & 0x1f000000) != 0x4000000) &&
        (5 < ((uint)(local_e8 >> 0x18) & 0x1e) - 0xe)) ||
       ((uVar18 & 0x1f000000) != 0x4000000 && 5 < (uVar18 >> 0x18 & 0x1e) - 0xe)) {
      MVar27 = MM_mod;
      goto LAB_0014b0dc;
    }
    uVar39 = lj_opt_narrow_mod(J,(uint)local_e8,uVar18,&local_d8,&TStack_d0);
    goto LAB_0014b204;
  case IR_KNULL:
  case IR_KNUM:
  case IR_KINT64:
  case IR_KSLOT:
  case IR_BNOT:
    IStack_a4 = (IRRef1)uStack_110;
    uStack_a2 = (undefined2)(uStack_110 >> 0x10);
    TStack_c8 = local_d8;
    local_d8.u64 = TStack_d0.u64;
    TStack_d0 = TVar12;
    uVar34 = uStack_110;
    local_a8 = lnk;
    if (IVar26 == IR_BNOT) goto LAB_0014a2d3;
LAB_0014a119:
    lnk = (TraceNo)uVar34;
    uVar18 = (uint)local_e8;
    if ((((uVar18 & 0x1f000000) == 0x4000000) || (((uint)(local_e8 >> 0x18) & 0x1e) - 0xe < 6)) &&
       ((lnk & 0x1f000000) == 0x4000000 || ((uint)(uVar34 >> 0x18) & 0x1e) - 0xe < 6)) {
      IVar44 = (uVar29 >> 0xb) + IR_BNOT;
LAB_0014a181:
      uVar39 = lj_opt_narrow_arith(J,uVar18,lnk,&local_d8,&TStack_d0,IVar44);
      goto LAB_0014b204;
    }
    MVar27 = (MMS)(uVar29 >> 0xb);
LAB_0014b0dc:
    rec_mm_arith(J,(RecordIndex *)&local_d8.gcr,MVar27);
    goto LAB_0014b248;
  case IR_BSHR:
    if (((uVar18 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uStack_110 >> 0x18) & 0x1e) - 0xe) ||
       ((lnk & 0x1f000000) != 0x4000000 && 5 < (uVar17 & 0x1e) - 0xe)) {
      MVar27 = MM_pow;
      goto LAB_0014b0dc;
    }
    IVar44 = IR_POW;
    goto LAB_0014a181;
  case IR_BSAR:
    uVar39 = rec_cat(J,uVar18,lnk);
    goto LAB_0014b204;
  case IR_BROL:
  case IR_SUB:
  case IR_MUL:
  case IR_STRTO:
    goto switchD_00149fad_caseD_27;
  case IR_BROR:
    uVar39 = lj_ir_kgc(J,*(GCobj **)((J->pt->k).ptr64 + ~local_e8 * 8),IRT_CDATA);
    goto LAB_0014b204;
  case IR_ADD:
    uVar39 = lj_ir_kint(J,(int)(short)uVar37);
    goto LAB_0014b204;
  case IR_DIV:
    if (J->maxslot < (uint)local_100) {
      J->base[(uint)local_100 - 1] = 0;
    }
    for (; (uint)local_100 <= lnk; local_100 = (ulong)((uint)local_100 + 1)) {
      J->base[local_100] = 0x7fff;
    }
    if (J->maxslot <= lnk) {
      J->maxslot = lnk + 1;
    }
    break;
  case IR_MOD:
    uVar39 = rec_upvalue(J,lnk,0);
    goto LAB_0014b204;
  case IR_POW:
  case IR_NEG:
  case IR_ABS:
  case IR_LDEXP:
    rec_upvalue(J,(uint)local_100,lnk);
    break;
  case IR_MIN:
  case IR_MAX:
    goto switchD_00149fad_caseD_32;
  case IR_FPMATH:
    IVar14 = 0x801;
    if ((lnk & 0x7ff) != 0x7ff) {
      IVar14 = (IRRef1)(lnk & 0x7ff);
    }
    (J->fold).ins.field_0.ot = 0x518b;
    (J->fold).ins.field_0.op1 = IVar14;
    (J->fold).ins.field_0.op2 = (IRRef1)(lnk >> 0xb);
    goto LAB_0014b1fc;
  case IR_ADDOV:
    TVar24 = lj_ir_kgc(J,*(GCobj **)((J->pt->k).ptr64 + ~local_e8 * 8),IRT_TAB);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x528b0000;
LAB_0014b1fc:
    uVar39 = lj_opt_fold(J);
    goto LAB_0014b204;
  case IR_SUBOV:
  case IR_MULOV:
    local_d8.u64 = (J->fn->c).env.gcptr64 | 0xfffa000000000000;
    TVar24 = getcurrf(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0001;
    local_a8 = lj_opt_fold(J);
    local_94 = 100;
    goto LAB_0014a285;
  case IR_AREF:
  case IR_HREFK:
  case IR_UREFO:
  case IR_UREFC:
    goto switchD_00149fad_caseD_38;
  case IR_HREF:
  case IR_FREF:
    TStack_d0.n = (lua_Number)(int)lnk;
    TVar24 = lj_ir_kint(J,lnk);
    IStack_a4 = (IRRef1)TVar24;
    uStack_a2 = (undefined2)(TVar24 >> 0x10);
    goto switchD_00149fad_caseD_38;
  case IR_NEWREF:
  case IR_STRREF:
    local_94 = 0;
LAB_0014a285:
    uVar39 = lj_record_idx(J,(RecordIndex *)&local_d8.gcr);
LAB_0014b204:
    local_e8 = (ulong)uVar39;
    break;
  case IR_TMPREF:
    pTVar43 = J->L->base;
    pTVar7 = J->L->top;
    k = TStack_d0._0_4_;
    uVar39 = (uint)local_100 - 1;
    local_78.u64 = pTVar43[uVar39].u64 & 0x7fffffffffff | 0xfffa000000000000;
    local_48 = J->base[uVar39];
    if (local_48 == 0) {
      local_48 = sload(J,uVar39);
    }
    local_34 = 0;
    for (uVar34 = local_100; uVar34 < ((ulong)((long)pTVar7 - (long)pTVar43) >> 3 & 0xffffffff);
        uVar34 = uVar34 + 1) {
      local_70 = (double)(int)k;
      local_44 = lj_ir_kint(J,k);
      local_68 = pTVar43[uVar34];
      TVar24 = J->base[uVar34];
      if (TVar24 == 0) {
        TVar24 = sload(J,(int32_t)uVar34);
      }
      local_40 = TVar24;
      lj_record_idx(J,(RecordIndex *)&local_78.gcr);
      k = k + 1;
    }
    J->maxslot = (uint)local_100;
    break;
  case IR_LREF:
    local_e8 = (ulong)(~(uint)local_100 + (int)((ulong)((long)J->L->top - (long)J->L->base) >> 3));
    goto LAB_0014adc7;
  case IR_ALOAD:
    goto LAB_0014adc7;
  case IR_HLOAD:
    local_e8 = (ulong)(~(uint)local_100 + (int)((ulong)((long)J->L->top - (long)J->L->base) >> 3));
    goto LAB_0014ada5;
  case IR_ULOAD:
LAB_0014ada5:
    lj_record_tailcall(J,(uint)local_100,local_e8 - 1);
    break;
  case IR_FLOAD:
    pTVar25 = J->base;
    TVar24 = pTVar25[(uint)local_100 - 3];
    if (TVar24 == 0) {
      TVar24 = sload(J,(uint)local_100 - 3);
      pTVar25 = J->base;
    }
    pTVar25[local_100] = TVar24;
    TVar24 = pTVar25[(uint)local_100 - 2];
    if (TVar24 == 0) {
      TVar24 = sload(J,(uint)local_100 - 2);
      pTVar25 = J->base;
    }
    pTVar25[(uint)local_100 + 2] = TVar24;
    TVar24 = pTVar25[(uint)local_100 - 1];
    if (TVar24 == 0) {
      TVar24 = sload(J,(uint)local_100 - 1);
      pTVar25 = J->base;
    }
    pTVar25[(uint)local_100 + 3] = TVar24;
    pTVar43 = J->L->base;
    pTVar43[local_100] = pTVar43[local_100 - 3];
    TVar12 = (pTVar43 + (local_100 - 2))[1];
    pTVar43[local_100 + 2] = pTVar43[local_100 - 2];
    (pTVar43 + local_100 + 2)[1] = TVar12;
LAB_0014adc7:
    lj_record_call(J,(uint)local_100,local_e8 - 1);
    break;
  case IR_XLOAD:
    LVar19 = rec_itern(J,(uint)local_100,uVar18);
    goto LAB_0014ad92;
  case IR_SLOAD:
    uVar34 = (ulong)J->pt->numparams;
    lVar41 = J->L->base[-1].it64 >> 3;
    uVar33 = ~uVar34;
    if (J->maxslot < (uint)local_100) {
      J->base[(uint)local_100 - 1] = 0;
    }
    uStack_110 = uStack_110 - 1;
    uVar40 = (lVar41 + uVar33) - 1;
    if (J->framedepth < 1) {
      uVar33 = uVar33 + lVar41;
      (J->fold).ins.field_0.ot = 0x4713;
      (J->fold).ins.field_1.op12 = 0x120001;
      local_90 = uVar34;
      TVar24 = lj_opt_fold(J);
      iVar22 = (int)local_90;
      local_f8 = iVar22 * 8 + 0x13;
      IVar14 = (IRRef1)TVar24;
      if (uVar18 != 0) {
        if ((long)uVar33 < 2) {
          TVar24 = lj_ir_kint(J,local_f8);
          (J->fold).ins.field_0.ot = 0x293;
          (J->fold).ins.field_0.op1 = IVar14;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar24;
          lj_opt_fold(J);
          uVar40 = 0;
        }
        else {
          if (uStack_110 < uVar33) {
            iVar35 = local_f8 + (int)uStack_110 * 8;
            IVar30 = 0x193;
            uVar34 = uStack_110;
          }
          else {
            iVar35 = J->L->base[-1].field_4.i;
            IVar30 = 0x893;
            uVar34 = uVar40;
          }
          TVar24 = lj_ir_kint(J,iVar35);
          (J->fold).ins.field_0.ot = IVar30;
          (J->fold).ins.field_0.op1 = IVar14;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar24;
          lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x2a15;
          (J->fold).ins.field_0.op1 = 0x8000;
          (J->fold).ins.field_0.op2 = IVar14;
          TVar24 = lj_opt_fold(J);
          TVar20 = lj_ir_kint64(J,(ulong)(uint)(iVar22 * 8) | 3);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
          TVar24 = lj_opt_fold(J);
          uVar33 = local_90;
          for (uVar42 = 0; uVar34 != uVar42; uVar42 = uVar42 + 1) {
            lVar9 = J->L->base[(uVar33 + uVar42) - lVar41].it64;
            IVar28 = ~(uint)(lVar9 >> 0x2f);
            if ((ulong)(lVar9 >> 0x2f) < 0xfffffffffffffff2) {
              IVar28 = IRT_NUM;
            }
            TVar20 = lj_record_vload(J,TVar24,(MSize)uVar42,IVar28);
            J->base[local_100 + uVar42] = TVar20;
          }
        }
        for (; (long)uVar40 < (long)uStack_110; uVar40 = uVar40 + 1) {
          J->base[local_100 + uVar40] = 0x7fff;
        }
        if ((uStack_110 != 1) || (J->maxslot <= (uint)local_100)) {
          J->maxslot = (int)uStack_110 + (uint)local_100;
        }
        break;
      }
      if ((J->pc[1] & 0xffff00ff) == 0x2010041) {
        uVar39 = J->pc[1] >> 8 & 0xff;
        aVar8 = J->L->base[uVar39].field_4;
        if ((aVar8.it >> 0xf == 0x1fff7) &&
           (pGVar36 = (GCobj *)((ulong)aVar8 & 0x7fffffffffff), (pGVar36->gch).unused1 == '\x10')) {
          TVar20 = lj_ir_kgc(J,pGVar36,IRT_FUNC);
          TVar24 = J->base[uVar39];
          if (TVar24 == 0) {
            TVar24 = sload(J,uVar39);
          }
          (J->fold).ins.field_0.ot = 0x888;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
          lj_opt_fold(J);
          TVar24 = J->base[(uint)local_100 - 1];
          iVar35 = lj_ffrecord_select_mode(J,TVar24,J->L->base + ((uint)local_100 - 1));
          if (-1 < iVar35) {
            lVar41 = (long)iVar35;
            local_80 = lVar41;
            if (iVar35 == 0) {
LAB_0014b8ee:
              if ((long)uVar33 <= lVar41) {
                TVar20 = lj_ir_kint(J,local_f8);
                IVar15 = (IRRef1)TVar20;
                if (iVar35 == 0) {
                  TVar20 = lj_ir_kint(J,0);
                }
                else {
                  TVar20 = lj_ir_kint(J,3);
                  (J->fold).ins.field_0.ot = 0x2413;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
                  TVar20 = lj_opt_fold(J);
                  (J->fold).ins.field_0.ot = 0x2913;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar20;
                  (J->fold).ins.field_0.op2 = IVar15;
                  TVar20 = lj_opt_fold(J);
                  IVar15 = (IRRef1)TVar20;
                  TVar20 = 0x7fff;
                }
                (J->fold).ins.field_0.ot = 0x93;
                (J->fold).ins.field_0.op1 = IVar14;
                (J->fold).ins.field_0.op2 = IVar15;
                lj_opt_fold(J);
                goto LAB_0014ba99;
              }
              TVar20 = lj_ir_kint(J,iVar22 * -8 + -0x13);
              (J->fold).ins.field_0.ot = 0x2913;
              (J->fold).ins.field_0.op1 = IVar14;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
              TVar20 = lj_opt_fold(J);
              if ((int)local_90 != 0) {
                TVar23 = lj_ir_kint(J,0);
                (J->fold).ins.field_0.ot = 0x193;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar20;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar23;
                lj_opt_fold(J);
              }
              TVar23 = lj_ir_kint(J,3);
              (J->fold).ins.field_0.ot = 0x2513;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar20;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar23;
              TVar20 = lj_opt_fold(J);
              if (iVar35 != 0) {
                TVar23 = lj_ir_kint(J,-1);
                (J->fold).ins.field_0.ot = 0x2913;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar23;
                TVar24 = lj_opt_fold(J);
                rec_idx_abc(J,TVar20,TVar24,(uint32_t)uVar40);
                goto LAB_0014ba99;
              }
            }
            else {
              if (4 < (TVar24 >> 0x18 & 0x1f) - 0xf) {
                if ((TVar24 & 0x1f000000) == 0x4000000) {
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
                  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5e8e0000;
                  TVar24 = lj_opt_fold(J);
                }
                (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b93226e;
                TVar24 = lj_opt_fold(J);
              }
              if ((short)TVar24 < 0) goto LAB_0014b8ee;
              TVar20 = lj_ir_kint(J,local_f8 + iVar35 * 8);
              (J->fold).ins.field_0.ot = (ushort)(lVar41 < (long)uVar33) << 8 | 0x93;
              (J->fold).ins.field_0.op1 = IVar14;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
              lj_opt_fold(J);
              local_f8 = iVar22 * 8 + 0xb;
              TVar20 = 0x7fff;
LAB_0014ba99:
              if ((iVar35 != 0) && (lVar41 = local_80 - uVar33, local_80 < (long)uVar33)) {
                (J->fold).ins.field_0.ot = 0x2a15;
                (J->fold).ins.field_0.op1 = 0x8000;
                (J->fold).ins.field_0.op2 = IVar14;
                TVar20 = lj_opt_fold(J);
                TVar23 = lj_ir_kint64(J,(long)(local_f8 + -0x10));
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar20;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar23;
                TVar20 = lj_opt_fold(J);
                lVar41 = J->L->base[lVar41 + -2].it64;
                IVar28 = IRT_NUM;
                if (0xfffffffffffffff1 < (ulong)(lVar41 >> 0x2f)) {
                  IVar28 = ~(uint)(lVar41 >> 0x2f);
                }
                (J->fold).ins.field_0.ot = 0x3809;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar20;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar24;
                TVar24 = lj_opt_fold(J);
                TVar20 = lj_record_vload(J,TVar24,0,IVar28);
              }
            }
            J->base[(uint)local_100 - 3] = TVar20;
            J->maxslot = (uint)local_100 - 2;
            J->bcskip = '\x02';
            break;
          }
        }
      }
      (J->errinfo).u64 = 0x4051c00000000000;
      goto LAB_0014bd97;
    }
    uVar34 = 0;
    if (0 < (long)uVar40) {
      uVar34 = uVar40;
    }
    if (uVar18 == 2) {
      uVar39 = J->maxslot;
      uStack_110 = 1;
      if (uVar39 <= (uint)local_100) {
        uStack_110 = 1;
        goto LAB_0014a5ef;
      }
    }
    else {
      if (uVar18 == 0) {
        uStack_110 = uVar34;
      }
LAB_0014a5ef:
      uVar39 = (int)uStack_110 + (uint)local_100;
      J->maxslot = uVar39;
    }
    if (0xf9 < uVar39 + J->baseslot) {
      TVar13 = LJ_TRERR_STACKOV;
LAB_0014bd71:
      lj_trace_err(J,TVar13);
    }
    for (uVar33 = 0; uStack_110 != uVar33; uVar33 = uVar33 + 1) {
      pTVar25 = J->base;
      TVar24 = 0x7fff;
      if (((long)uVar33 < (long)uVar40) && (TVar24 = pTVar25[(uVar33 - 2) - uVar34], TVar24 == 0)) {
        TVar24 = sload(J,(-2 - (int)uVar34) + (int)uVar33);
        pTVar25 = J->base;
      }
      pTVar25[local_100 + uVar33] = TVar24;
    }
    goto switchD_00149fad_caseD_27;
  case IR_VLOAD:
    pTVar43 = J->L->base;
    uVar39 = (uint)local_100 - 3;
    if ((((pTVar43[uVar39].field_4.it >> 0xf != 0x1fff7) ||
         (*(char *)(((ulong)pTVar43[uVar39].field_4 & 0x7fffffffffff) + 10) != '\x04')) ||
        ((pTVar43[(ulong)uVar39 + 1].u64 & 0xffff800000000000) != 0xfffa000000000000)) ||
       (pTVar43[(ulong)uVar39 + 2].u64 != 0xffffffffffffffff)) {
      lj_trace_err(J,LJ_TRERR_RECERR);
    }
    TVar24 = J->base[uVar39];
    if (TVar24 == 0) {
      TVar24 = sload(J,uVar39);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45100003;
    TVar24 = lj_opt_fold(J);
    TVar20 = lj_ir_kint(J,4);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar24;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
    lj_opt_fold(J);
    pTVar25 = J->base;
    if (pTVar25[(uint)local_100 - 2] == 0) {
      sload(J,(uint)local_100 - 2);
      pTVar25 = J->base;
    }
    uVar39 = (uint)local_100 - 1;
    if (pTVar25[uVar39] == 0) {
      sload(J,uVar39);
    }
    TVar24 = lj_ir_kint(J,0);
    J->base[uVar39] = TVar24 | 0x100000;
    J->maxslot = (uint)local_100;
    break;
  case IR_ALEN:
    local_e8 = (ulong)(((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - (uint)local_100) +
                      1);
    goto LAB_0014a8de;
  case IR_ASTORE:
  case IR_HSTORE:
  case IR_USTORE:
LAB_0014a8de:
    if (J->prof_mode == 0x66) {
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      J->prev_pt = (GCproto *)0x0;
      lj_snap_add(J);
    }
    lj_record_ret(J,(uint)local_100,local_e8 - 1);
    break;
  case IR_FSTORE:
    LVar19 = rec_for(J,pc,0);
    if (LVar19 != LOOPEV_LEAVE) {
      J->loopref = (J->cur).nins;
    }
    break;
  case IR_XSTORE:
    LVar19 = rec_for(J,pc,0);
    if (LVar19 != LOOPEV_LEAVE) {
      lj_record_stop(J,LJ_TRLINK_ROOT,(uint)*(ushort *)((long)pc + local_e8 * 4 + -0x1fffe));
    }
    break;
  case IR_SNEW:
    LVar19 = rec_for(J,pc + (local_e8 - 0x8000),1);
    goto LAB_0014ac03;
  case IR_XSNEW:
  case IR_CNEW:
  case IR_BUFPUT:
  case IR_XBAR:
  case IR_TOSTR:
    TVar13 = LJ_TRERR_BLACKL;
    goto LAB_0014bd71;
  case IR_TNEW:
    LVar19 = rec_for(J,pc + ((ulong)*(ushort *)(J->trace[local_e8].gcptr64 + 0x52) - 0x8000),1);
    goto LAB_0014aaf3;
  case IR_TDUP:
    LVar19 = rec_iterl(J,*pc);
LAB_0014ac03:
    rec_loop_interp(J,pc,LVar19);
    break;
  case IR_CNEWI:
    LVar19 = rec_iterl(J,*(BCIns *)(J->trace[local_e8].gcptr64 + 0x50));
LAB_0014aaf3:
    rec_loop_jit(J,lnk,LVar19);
    break;
  case IR_BUFHDR:
    if ((uint)local_100 < J->maxslot) {
      J->maxslot = (uint)local_100;
    }
    J->pc = J->pc + 1;
    LVar19 = LOOPEV_ENTER;
LAB_0014ad92:
    rec_loop_interp(J,pc,LVar19);
    break;
  case IR_BUFSTR:
    bVar3 = *(byte *)(J->trace[local_e8].gcptr64 + 0x50);
    if ((uint)local_100 < J->maxslot) {
      J->maxslot = (uint)local_100;
    }
    J->pc = J->pc + (bVar3 != 0x46 && bVar3 - 0x4d < 0xfffffffc);
    rec_loop_jit(J,lnk,LOOPEV_ENTER);
    break;
  case IR_TBAR:
    if ((uint)local_100 < J->maxslot) {
      J->maxslot = (uint)local_100;
    }
    break;
  case IR_OBAR:
    rec_func_lua(J);
    break;
  case IR_CONV:
    rec_func_setup(J);
    uVar6 = J->trace[local_e8].gcptr64;
    if (*(char *)(uVar6 + 0x74) == '\a') {
      check_call_unroll(J,lnk);
      pBVar10 = J->pc;
      J->patchins = *pBVar10;
      J->patchpc = pBVar10;
      *pBVar10 = *(BCIns *)(uVar6 + 0x50);
    }
    else {
      J->instunroll = 0;
      if ((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) {
        lnk = (TraceNo)(J->cur).traceno;
        linktype = LJ_TRLINK_TAILREC;
      }
      else {
        linktype = LJ_TRLINK_ROOT;
      }
      lj_record_stop(J,linktype,lnk);
    }
    break;
  case IR_TOBIT:
    pGVar4 = J->pt;
    uVar39 = J->maxslot;
    uVar17 = uVar39 + 2;
    if (0xf9 < (uint)pGVar4->framesize + J->baseslot + uVar17) {
      TVar13 = LJ_TRERR_STACKOV;
      goto LAB_0014bd62;
    }
    pTVar25 = J->base;
    pTVar25[uVar39] = pTVar25[-2];
    pTVar25[uVar39 + 1] = 0x10000;
    uVar39 = (uint)pGVar4->numparams;
    if (J->maxslot < uVar39) {
      uVar39 = J->maxslot;
    }
    for (uVar34 = 0; uVar39 != uVar34; uVar34 = uVar34 + 1) {
      pTVar25[uVar17 + (int)uVar34] = pTVar25[uVar34];
      pTVar25[uVar34] = 0x7fff;
    }
    J->maxslot = uVar39;
    J->framedepth = J->framedepth + 1;
    J->base = pTVar25 + uVar17;
    J->baseslot = J->baseslot + uVar17;
    rec_func_lua(J);
    break;
  case IR_CALLN:
  case IR_CALLA:
switchD_00149fad_caseD_5f:
    lj_ffrecord_func(J);
    break;
  default:
    if (IR_CALLA < IVar26) goto switchD_00149fad_caseD_5f;
    goto switchD_00149fad_caseD_32;
  }
LAB_0014b20c:
  if (((short)local_84 == 1) && ((TRef)local_e8 != 0)) {
    pTVar25 = J->base;
    uVar39 = (uint)local_100;
    pTVar25[local_100] = (TRef)local_e8;
    if (J->maxslot <= uVar39) {
      if (J->maxslot < uVar39) {
        pTVar25[uVar39 - 1] = 0;
      }
      J->maxslot = uVar39 + 1;
    }
  }
LAB_0014b248:
  if (((J->cur).nins <= J->param[1] + 0x8001U) && (0x8000U - J->param[2] <= (J->cur).nk)) {
    return;
  }
  TVar13 = LJ_TRERR_TRACEOV;
LAB_0014bd62:
  lj_trace_err(J,TVar13);
switchD_00149fad_caseD_38:
  local_94 = 100;
  goto LAB_0014a285;
switchD_00149fad_caseD_27:
  goto LAB_0014b20c;
switchD_00149fad_caseD_32:
  (J->errinfo).n = (double)IVar26;
LAB_0014bd97:
  lj_trace_err_info(J,LJ_TRERR_NYIBC);
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    tv->u32.hi == LJ_KEYINDEX ? (lj_ir_kint(J, 0) | TREF_KEYINDEX) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = emitir(IRTI(IR_ALEN), rc, TREF_NIL);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv, IR_POW);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    J->maxslot = ra;  /* The table slot at ra-1 is the highest used slot. */
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_ITERN:
    rec_loop_interp(J, pc, rec_itern(J, ra, rb));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins)) &&
				 bc_op(traceref(J, rc)->startins) != BC_ITERN));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  case BC_ISNEXT:
    rec_isnext(J, ra);
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}